

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O2

QPoint __thiscall QPushButtonPrivate::adjustedMenuPosition(QPushButtonPrivate *this)

{
  QWidget *this_00;
  int iVar1;
  Orientation OVar2;
  uint uVar3;
  uint uVar4;
  LayoutDirection LVar5;
  QToolBar *this_01;
  undefined8 uVar6;
  QPoint QVar7;
  int iVar8;
  QPoint QVar9;
  Representation RVar10;
  Representation RVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QRect QVar14;
  QRect QVar15;
  int local_90;
  Representation local_88;
  QPoint local_60;
  QPoint local_58;
  QWidgetItem local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  this_01 = QtPrivate::qobject_cast_helper<QToolBar*,QObject>
                      (*(QObject **)
                        &(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x10);
  if (this_01 == (QToolBar *)0x0) {
    bVar13 = true;
  }
  else {
    OVar2 = QToolBar::orientation(this_01);
    bVar13 = OVar2 != Vertical;
  }
  local_50.super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x0;
  local_50.super_QLayoutItem._12_4_ = 0xaaaaaaaa;
  local_50.super_QLayoutItem._vptr_QLayoutItem = (_func_int **)&PTR__QWidgetItem_007c0d88;
  local_50.wid = this_00;
  QVar14 = QWidgetItem::geometry(&local_50);
  uVar3 = QWidget::x(this_00);
  RVar10.m_i = QVar14.x1.m_i.m_i - uVar3;
  uVar4 = QWidget::y(this_00);
  RVar11.m_i = QVar14.y1.m_i.m_i - uVar4;
  iVar8 = (QVar14.x2.m_i.m_i + 1) - QVar14.x1.m_i;
  QVar9.yp.m_i = RVar11.m_i;
  QVar9.xp.m_i = RVar10.m_i;
  uVar6 = (**(code **)(*(long *)(this->menu).wp.value + 0x70))();
  local_58 = QVar9;
  QVar7 = QWidget::mapToGlobal(this_00,&local_58);
  uVar12 = (ulong)QVar7 >> 0x20;
  local_60 = (QPoint)(((long)(int)(~uVar3 + QVar14.x2.m_i.m_i + 1) + (long)RVar10.m_i) / 2 &
                      0xffffffffU |
                     ((long)(int)(~uVar4 + 1 + QVar14.y2.m_i.m_i) + (long)RVar11.m_i) / 2 << 0x20);
  local_58 = QWidget::mapToGlobal(this_00,&local_60);
  QVar15 = QWidgetPrivate::availableScreenGeometry(this_00,&local_58,true);
  local_88 = QVar7.xp.m_i;
  local_90 = (int)uVar6;
  if (bVar13) {
    RVar11 = QVar7.yp.m_i;
    uVar3 = ((QVar14.y2.m_i.m_i + 1) - QVar14.y1.m_i) + RVar11.m_i;
    iVar1 = (int)((ulong)uVar6 >> 0x20);
    RVar10.m_i = RVar11.m_i - iVar1;
    if (RVar10.m_i < QVar15.y1.m_i.m_i) {
      RVar10.m_i = RVar11.m_i;
    }
    if ((int)(iVar1 + uVar3) <= QVar15.y2.m_i.m_i) {
      RVar10.m_i = uVar3;
    }
    uVar12 = (ulong)(uint)RVar10.m_i;
    LVar5 = QWidget::layoutDirection(this_00);
    if (LVar5 == RightToLeft) {
      QVar7.yp.m_i = 0;
      QVar7.xp.m_i = (iVar8 - local_90) + local_88.m_i;
    }
  }
  else {
    RVar10.m_i = iVar8 + local_88.m_i;
    iVar8 = (**(code **)(*(long *)(this->menu).wp.value + 0x70))();
    if ((QVar15.x2.m_i.m_i < iVar8 + RVar10.m_i) &&
       (RVar10.m_i = local_88.m_i - local_90, local_88.m_i - local_90 < QVar15.x1.m_i.m_i)) {
      RVar10.m_i = local_88.m_i;
    }
    QVar7.yp.m_i = 0;
    QVar7.xp.m_i = RVar10.m_i;
  }
  QWidgetItem::~QWidgetItem(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QPoint)((ulong)QVar7 & 0xffffffff | uVar12 << 0x20);
}

Assistant:

QPoint QPushButtonPrivate::adjustedMenuPosition()
{
    Q_Q(QPushButton);

    bool horizontal = true;
#if QT_CONFIG(toolbar)
    QToolBar *tb = qobject_cast<QToolBar*>(parent);
    if (tb && tb->orientation() == Qt::Vertical)
        horizontal = false;
#endif

    QWidgetItem item(q);
    QRect rect = item.geometry();
    rect.setRect(rect.x() - q->x(), rect.y() - q->y(), rect.width(), rect.height());

    QSize menuSize = menu->sizeHint();
    QPoint globalPos = q->mapToGlobal(rect.topLeft());
    int x = globalPos.x();
    int y = globalPos.y();
    const QRect availableGeometry = QWidgetPrivate::availableScreenGeometry(q, q->mapToGlobal(rect.center()));
    if (horizontal) {
        if (globalPos.y() + rect.height() + menuSize.height() <= availableGeometry.bottom()) {
            y += rect.height();
        } else if (globalPos.y() - menuSize.height() >= availableGeometry.y()) {
            y -= menuSize.height();
        }
        if (q->layoutDirection() == Qt::RightToLeft)
            x += rect.width() - menuSize.width();
    } else {
        if (globalPos.x() + rect.width() + menu->sizeHint().width() <= availableGeometry.right()) {
            x += rect.width();
        } else if (globalPos.x() - menuSize.width() >= availableGeometry.x()) {
            x -= menuSize.width();
        }
    }

    return QPoint(x,y);
}